

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O2

bool __thiscall
MeCab::anon_unknown_0::TaggerImpl::parseNBestInit(TaggerImpl *this,char *str,size_t len)

{
  int iVar1;
  Lattice *pLVar2;
  
  pLVar2 = mutable_lattice(this);
  (*pLVar2->_vptr_Lattice[10])(pLVar2,str,len);
  initRequestType(this);
  (*pLVar2->_vptr_Lattice[0x14])(pLVar2,2);
  iVar1 = (**(this->super_Tagger)._vptr_Tagger)(this,pLVar2);
  if (SUB41(iVar1,0) == false) {
    (*pLVar2->_vptr_Lattice[0x24])(pLVar2);
    std::__cxx11::string::assign((char *)&this->what_);
  }
  return SUB41(iVar1,0);
}

Assistant:

bool TaggerImpl::parseNBestInit(const char *str, size_t len) {
  Lattice *lattice = mutable_lattice();
  lattice->set_sentence(str, len);
  initRequestType();
  lattice->add_request_type(MECAB_NBEST);
  if (!parse(lattice)) {
    set_what(lattice->what());
    return false;
  }
  return true;
}